

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logging.cc
# Opt level: O0

void google::LogDestination::SetLogSymlink(LogSeverity severity,char *symlink_basename)

{
  int iVar1;
  int iVar2;
  LogDestination *this;
  MutexLock local_60;
  MutexLock l;
  LogMessage local_50;
  string *local_40;
  _Check_string *_result_1;
  LogMessage local_30;
  string *local_20;
  _Check_string *_result;
  char *symlink_basename_local;
  LogSeverity severity_local;
  
  _result = (_Check_string *)symlink_basename;
  symlink_basename_local._4_4_ = severity;
  iVar1 = GetReferenceableValue(severity);
  iVar2 = GetReferenceableValue(0);
  local_20 = Check_GEImpl_abi_cxx11_(iVar1,iVar2,"severity >= 0");
  if (local_20 != (string *)0x0) {
    CheckOpString::CheckOpString((CheckOpString *)&_result_1,local_20);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_30,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x262,(CheckOpString *)&_result_1);
    LogMessage::stream(&local_30);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_30);
  }
  iVar1 = GetReferenceableValue(symlink_basename_local._4_4_);
  iVar2 = GetReferenceableValue(4);
  local_40 = Check_LTImpl_abi_cxx11_(iVar1,iVar2,"severity < NUM_SEVERITIES");
  if (local_40 != (string *)0x0) {
    CheckOpString::CheckOpString((CheckOpString *)&l,local_40);
    LogMessageFatal::LogMessageFatal
              ((LogMessageFatal *)&local_50,
               "/workspace/llm4binary/github/license_all_cmakelists_25/huihut[P]glog/src/logging.cc"
               ,0x263,(CheckOpString *)&l);
    LogMessage::stream(&local_50);
    LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_50);
  }
  ::glog_internal_namespace_::MutexLock::MutexLock(&local_60,(Mutex *)log_mutex);
  this = log_destination(symlink_basename_local._4_4_);
  anon_unknown_10::LogFileObject::SetSymlinkBasename(&this->fileobject_,(char *)_result);
  ::glog_internal_namespace_::MutexLock::~MutexLock(&local_60);
  return;
}

Assistant:

inline void LogDestination::SetLogSymlink(LogSeverity severity,
                                          const char* symlink_basename) {
  CHECK_GE(severity, 0);
  CHECK_LT(severity, NUM_SEVERITIES);
  MutexLock l(&log_mutex);
  log_destination(severity)->fileobject_.SetSymlinkBasename(symlink_basename);
}